

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O3

void RDL_deleteCycleIterator(RDL_cycleIterator *it)

{
  if (it->it1 != (RDL_pathIterator *)0x0) {
    RDL_deletePathIterator(it->it1);
  }
  if (it->it2 != (RDL_pathIterator *)0x0) {
    RDL_deletePathIterator(it->it2);
  }
  if (it->compressed_cycle != (uchar *)0x0) {
    free(it->compressed_cycle);
  }
  free(it);
  return;
}

Assistant:

void RDL_deleteCycleIterator(RDL_cycleIterator* it)
{
  if (it->it1) {
    RDL_deletePathIterator(it->it1);
  }
  if (it->it2) {
    RDL_deletePathIterator(it->it2);
  }

  if (it->compressed_cycle) {
    free(it->compressed_cycle);
  }

  free(it);
}